

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_ialltoall_(void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,void *recvbuf,
                      MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *comm,
                      MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  MPIABI_Fint *recvtype_local;
  MPIABI_Fint *recvcount_local;
  void *recvbuf_local;
  MPIABI_Fint *sendtype_local;
  MPIABI_Fint *sendcount_local;
  void *sendbuf_local;
  
  mpi_ialltoall_(sendbuf,sendcount,sendtype,recvbuf,recvcount,recvtype,comm,request,ierror);
  return;
}

Assistant:

void mpiabi_ialltoall_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ialltoall_(
    sendbuf,
    sendcount,
    sendtype,
    recvbuf,
    recvcount,
    recvtype,
    comm,
    request,
    ierror
  );
}